

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

int __thiscall
CVmObjVector::getp_prepend(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  CVmObjVector *in_RDI;
  CVmNativeCodeDesc *in_stack_ffffffffffffffb8;
  vm_val_t *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffe8;
  CVmObjVector *this_00;
  
  this_00 = in_RDI;
  if ((getp_prepend(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_prepend(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_prepend::desc,1);
    __cxa_guard_release(&getp_prepend(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffffc8,(uint *)in_RDI,in_stack_ffffffffffffffb8);
  if (iVar1 == 0) {
    insert_elements_undo(this_00,in_ESI,in_stack_ffffffffffffffe8,(int)((ulong)in_RDX >> 0x20));
    CVmStack::get(0);
    set_element(in_RDI,(size_t)in_stack_ffffffffffffffb8,(vm_val_t *)0x34ce9a);
    vm_val_t::set_obj(in_RDX,in_ESI);
    CVmStack::discard(1);
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_prepend(VMG_ vm_obj_id_t self, vm_val_t *retval,
                               uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* insert one element at the start of the vector */
    insert_elements_undo(vmg_ self, 0, 1);

    /* 
     *   set the first element - note that there's no need to save undo,
     *   since undoing this operation will simply discard this element (in
     *   other words, there's no previous value for this element since it's
     *   being created anew here) 
     */
    set_element(0, G_stk->get(0));

    /* the return value is 'self' */
    retval->set_obj(self);

    /* discard arguments */
    G_stk->discard(1);

    /* handled */
    return TRUE;
}